

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateTabFocus(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  bool local_19;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  local_19 = false;
  if ((((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
       (local_19 = false, (GImGui->NavWindow->Active & 1U) != 0)) &&
      (local_19 = false, (GImGui->NavWindow->Flags & 0x40000U) == 0)) &&
     (local_19 = false, ((GImGui->IO).KeyCtrl & 1U) == 0)) {
    local_19 = IsKeyPressedMap(0,true);
  }
  pIVar2->TabFocusPressed = local_19;
  if ((pIVar2->ActiveId == 0) && ((pIVar2->TabFocusPressed & 1U) != 0)) {
    pIVar2->TabFocusRequestNextWindow = pIVar2->NavWindow;
    pIVar2->TabFocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar2->NavId == 0) || (pIVar2->NavIdTabCounter == 0x7fffffff)) {
      iVar3 = 0;
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      pIVar2->TabFocusRequestNextCounterTabStop = iVar3;
    }
    else {
      iVar3 = 0;
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      pIVar2->TabFocusRequestNextCounterTabStop = pIVar2->NavIdTabCounter + iVar3;
    }
  }
  pIVar2->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar2->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar2->TabFocusRequestCurrCounterRegular = 0x7fffffff;
  if (pIVar2->TabFocusRequestNextWindow != (ImGuiWindow *)0x0) {
    pIVar1 = pIVar2->TabFocusRequestNextWindow;
    pIVar2->TabFocusRequestCurrWindow = pIVar1;
    if ((pIVar2->TabFocusRequestNextCounterRegular != 0x7fffffff) &&
       ((pIVar1->DC).FocusCounterRegular != -1)) {
      iVar3 = ImModPositive(pIVar2->TabFocusRequestNextCounterRegular,
                            (pIVar1->DC).FocusCounterRegular + 1);
      pIVar2->TabFocusRequestCurrCounterRegular = iVar3;
    }
    if ((pIVar2->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
       ((pIVar1->DC).FocusCounterTabStop != -1)) {
      iVar3 = ImModPositive(pIVar2->TabFocusRequestNextCounterTabStop,
                            (pIVar1->DC).FocusCounterTabStop + 1);
      pIVar2->TabFocusRequestCurrCounterTabStop = iVar3;
    }
    pIVar2->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar2->TabFocusRequestNextCounterTabStop = 0x7fffffff;
    pIVar2->TabFocusRequestNextCounterRegular = 0x7fffffff;
  }
  pIVar2->NavIdTabCounter = 0x7fffffff;
  return;
}

Assistant:

void ImGui::UpdateTabFocus()
{
    ImGuiContext& g = *GImGui;

    // Pressing TAB activate widget focus
    g.TabFocusPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.TabFocusPressed)
    {
        // - This path is only taken when no widget are active/tabbed-into yet.
        //   Subsequent tabbing will be processed by FocusableItemRegister()
        // - Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        //   manipulate the Next fields here even though they will be turned into Curr fields below.
        g.TabFocusRequestNextWindow = g.NavWindow;
        g.TabFocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.TabFocusRequestNextCounterTabStop = g.NavIdTabCounter + (g.IO.KeyShift ? -1 : 0);
        else
            g.TabFocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.TabFocusRequestCurrWindow = NULL;
    g.TabFocusRequestCurrCounterRegular = g.TabFocusRequestCurrCounterTabStop = INT_MAX;
    if (g.TabFocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.TabFocusRequestNextWindow;
        g.TabFocusRequestCurrWindow = window;
        if (g.TabFocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.TabFocusRequestCurrCounterRegular = ImModPositive(g.TabFocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.TabFocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.TabFocusRequestCurrCounterTabStop = ImModPositive(g.TabFocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.TabFocusRequestNextWindow = NULL;
        g.TabFocusRequestNextCounterRegular = g.TabFocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;
}